

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::deviceFeatures2(TestStatus *__return_storage_ptr__,Context *context)

{
  RefData<vk::VkInstance_s_*> data;
  VkAllocationCallbacks *platformInterface;
  deBool dVar1;
  int iVar2;
  VkInstance_s **ppVVar3;
  size_type sVar4;
  const_reference ppVVar5;
  TestError *pTVar6;
  allocator<char> local_411;
  string local_410;
  undefined1 local_3f0 [8];
  VkPhysicalDeviceFeatures2KHR extFeatures;
  VkPhysicalDeviceFeatures coreFeatures;
  size_t deviceNdx;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  InstanceDriver vki;
  Move<vk::VkInstance_s_*> local_68;
  RefData<vk::VkInstance_s_*> local_50;
  undefined1 local_38 [8];
  Unique<vk::VkInstance_s_*> instance;
  PlatformInterface *vkp;
  Context *context_local;
  
  instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getPlatformInterface(context);
  createInstanceWithExtension
            (&local_68,
             (PlatformInterface *)
             instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             "VK_KHR_get_physical_device_properties2");
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_50,(Move *)&local_68);
  data.deleter.m_destroyInstance = local_50.deleter.m_destroyInstance;
  data.object = local_50.object;
  data.deleter.m_allocator = local_50.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique((Unique<vk::VkInstance_s_*> *)local_38,data);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_68);
  platformInterface = instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator;
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)local_38);
  ::vk::InstanceDriver::InstanceDriver
            ((InstanceDriver *)
             &devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (PlatformInterface *)platformInterface,*ppVVar3);
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)local_38);
  ::vk::enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &deviceNdx,
             (InstanceInterface *)
             &devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar3);
  coreFeatures.variableMultisampleRate = 0;
  coreFeatures.inheritedQueries = 0;
  do {
    sVar4 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                      ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                        *)&deviceNdx);
    if (sVar4 <= (ulong)coreFeatures._212_8_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,"Querying device features succeeded",&local_411);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator(&local_411);
      std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::~vector
                ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
                 &deviceNdx);
      ::vk::InstanceDriver::~InstanceDriver
                ((InstanceDriver *)
                 &devices.
                  super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::vk::refdetails::Unique<vk::VkInstance_s_*>::~Unique((Unique<vk::VkInstance_s_*> *)local_38);
      return __return_storage_ptr__;
    }
    ::deMemset(&extFeatures.field_0xec,0xcd,0xdc);
    ::deMemset(&extFeatures.pNext,0xcd,0xdc);
    local_3f0._0_4_ = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR;
    extFeatures.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    extFeatures._4_4_ = 0;
    ppVVar5 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
              operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          *)&deviceNdx,coreFeatures._212_8_);
    ::vk::InstanceDriver::getPhysicalDeviceFeatures
              ((InstanceDriver *)
               &devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar5,
               (VkPhysicalDeviceFeatures *)&extFeatures.field_0xec);
    ppVVar5 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
              operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          *)&deviceNdx,coreFeatures._212_8_);
    ::vk::InstanceDriver::getPhysicalDeviceFeatures2KHR
              ((InstanceDriver *)
               &devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar5,
               (VkPhysicalDeviceFeatures2KHR *)local_3f0);
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (local_3f0._0_4_ != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,
                   "extFeatures.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x8b1);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (extFeatures._0_8_ != 0)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,"extFeatures.pNext == DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x8b2);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    iVar2 = deMemCmp(&extFeatures.field_0xec,&extFeatures.pNext,0xdc);
    if (iVar2 != 0) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,
                 "Mismatch between features reported by vkGetPhysicalDeviceFeatures and vkGetPhysicalDeviceFeatures2KHR"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                 ,0x8b5);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    coreFeatures._212_8_ = coreFeatures._212_8_ + 1;
  } while( true );
}

Assistant:

tcu::TestStatus deviceFeatures2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		VkPhysicalDeviceFeatures		coreFeatures;
		VkPhysicalDeviceFeatures2KHR	extFeatures;

		deMemset(&coreFeatures, 0xcd, sizeof(coreFeatures));
		deMemset(&extFeatures.features, 0xcd, sizeof(extFeatures.features));

		extFeatures.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR;
		extFeatures.pNext = DE_NULL;

		vki.getPhysicalDeviceFeatures(devices[deviceNdx], &coreFeatures);
		vki.getPhysicalDeviceFeatures2KHR(devices[deviceNdx], &extFeatures);

		TCU_CHECK(extFeatures.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR);
		TCU_CHECK(extFeatures.pNext == DE_NULL);

		if (deMemCmp(&coreFeatures, &extFeatures.features, sizeof(VkPhysicalDeviceFeatures)) != 0)
			TCU_FAIL("Mismatch between features reported by vkGetPhysicalDeviceFeatures and vkGetPhysicalDeviceFeatures2KHR");
	}

	return tcu::TestStatus::pass("Querying device features succeeded");
}